

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.h
# Opt level: O0

void __thiscall sptk::StatisticsAccumulation::Buffer::~Buffer(Buffer *this)

{
  SymmetricMatrix *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  in_RDI->_vptr_SymmetricMatrix = (_func_int **)&PTR__Buffer_0012ac68;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  SymmetricMatrix::~SymmetricMatrix(in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

virtual ~Buffer() {
    }